

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void Curl_hash_clean(Curl_hash *h)

{
  Curl_hash_element **ppCVar1;
  Curl_hash_element *he;
  ulong uVar2;
  
  if (((h != (Curl_hash *)0x0) && (h->table != (Curl_hash_element **)0x0)) && (h->slots != 0)) {
    uVar2 = 0;
    do {
      ppCVar1 = h->table;
      while (he = ppCVar1[uVar2], he != (Curl_hash_element *)0x0) {
        ppCVar1[uVar2] = he->next;
        h->size = h->size - 1;
        hash_elem_destroy(h,he);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < h->slots);
  }
  return;
}

Assistant:

void Curl_hash_clean(struct Curl_hash *h)
{
  if(h && h->table) {
    struct Curl_hash_element *he, **he_anchor;
    size_t i;
    DEBUGASSERT(h->init == HASHINIT);
    for(i = 0; i < h->slots; ++i) {
      he_anchor = &h->table[i];
      while(*he_anchor) {
        he = *he_anchor;
        hash_elem_unlink(h, he_anchor, he);
        hash_elem_destroy(h, he);
      }
    }
  }
}